

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O0

void ga_sort_scat_flt_(Integer *pn,float *v,Integer *i,Integer *j,Integer *base)

{
  undefined4 uVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined4 *in_RSI;
  ulong *in_RDI;
  long *in_R8;
  int ib_2;
  int ia_2;
  float dtmp_2;
  Integer ltmp_2;
  int ib_1;
  int ia_1;
  float dtmp_1;
  Integer ltmp_1;
  long *plStack_50;
  int ib;
  int ia;
  float dtmp;
  Integer ltmp;
  Integer *base0;
  Integer n;
  Integer *hi;
  Integer *q;
  Integer *p;
  unsigned_long g;
  unsigned_long gap;
  
  if (1 < (long)*in_RDI) {
    n = (long)*in_RDI >> 1;
    plStack_50 = in_R8 + n * 2 + -1;
    if ((*in_RDI & 1) != 0) {
      plStack_50 = plStack_50 + 1;
    }
    for (; n != 1; n = n + -1) {
      base0 = (Integer *)n;
      ltmp = (Integer)(in_R8 + n + -1);
      while (_ia = (long *)(ltmp + (long)base0 * 8), _ia <= plStack_50) {
        base0 = (Integer *)((long)base0 * 2);
        if ((_ia != plStack_50) && (*_ia < _ia[1])) {
          _ia = _ia + 1;
          base0 = (Integer *)((long)base0 + 1);
        }
        if (*_ia <= *(long *)ltmp) break;
        iVar4 = (int)(ltmp - (long)in_R8 >> 3);
        iVar5 = (int)((long)_ia - (long)in_R8 >> 3);
        lVar2 = *(long *)ltmp;
        *(long *)ltmp = *_ia;
        *_ia = lVar2;
        uVar1 = in_RSI[iVar4];
        in_RSI[iVar4] = in_RSI[iVar5];
        in_RSI[iVar5] = uVar1;
        uVar3 = in_RDX[iVar4];
        in_RDX[iVar4] = in_RDX[iVar5];
        in_RDX[iVar5] = uVar3;
        uVar3 = in_RCX[iVar4];
        in_RCX[iVar4] = in_RCX[iVar5];
        in_RCX[iVar5] = uVar3;
        ltmp = (Integer)_ia;
      }
    }
    for (; plStack_50 != in_R8; plStack_50 = plStack_50 + -1) {
      base0 = (Integer *)0x1;
      ltmp = (Integer)in_R8;
      while (_ia = (long *)(ltmp + (long)base0 * 8), _ia <= plStack_50) {
        base0 = (Integer *)((long)base0 * 2);
        if ((_ia != plStack_50) && (*_ia < _ia[1])) {
          _ia = _ia + 1;
          base0 = (Integer *)((long)base0 + 1);
        }
        if (*_ia <= *(long *)ltmp) break;
        iVar4 = (int)(ltmp - (long)in_R8 >> 3);
        iVar5 = (int)((long)_ia - (long)in_R8 >> 3);
        lVar2 = *(long *)ltmp;
        *(long *)ltmp = *_ia;
        *_ia = lVar2;
        uVar1 = in_RSI[iVar4];
        in_RSI[iVar4] = in_RSI[iVar5];
        in_RSI[iVar5] = uVar1;
        uVar3 = in_RDX[iVar4];
        in_RDX[iVar4] = in_RDX[iVar5];
        in_RDX[iVar5] = uVar3;
        uVar3 = in_RCX[iVar4];
        in_RCX[iVar4] = in_RCX[iVar5];
        in_RCX[iVar5] = uVar3;
        ltmp = (Integer)_ia;
      }
      iVar4 = (int)((long)plStack_50 - (long)in_R8 >> 3);
      lVar2 = *in_R8;
      *in_R8 = *plStack_50;
      *plStack_50 = lVar2;
      uVar1 = *in_RSI;
      *in_RSI = in_RSI[iVar4];
      in_RSI[iVar4] = uVar1;
      uVar3 = *in_RDX;
      *in_RDX = in_RDX[iVar4];
      in_RDX[iVar4] = uVar3;
      uVar3 = *in_RCX;
      *in_RCX = in_RCX[iVar4];
      in_RCX[iVar4] = uVar3;
    }
  }
  return;
}

Assistant:

static void ga_sort_scat_flt_(pn, v, i, j, base)
     Integer *pn;
     float   *v;
     Integer *i;
     Integer *j;
     Integer *base;
{
 
  if (*pn < 2) return;
 
#  undef SWAP
#  define SWAP(a,b) { \
    Integer ltmp; \
    float dtmp; \
    int ia = a - base; \
    int ib = b - base; \
    ltmp=*a; *a=*b; *b=ltmp; \
    dtmp=v[ia]; v[ia]=v[ib]; v[ib]=dtmp; \
    ltmp=i[ia]; i[ia]=i[ib]; i[ib]=ltmp; \
    ltmp=j[ia]; j[ia]=j[ib]; j[ib]=ltmp; \
  }
  INDEX_SORT(base,pn,SWAP);
}